

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O1

void __thiscall
myEmployeeCustomConstructor::ArchiveIN(myEmployeeCustomConstructor *this,ChArchiveIn *marchive)

{
  chrono::ChArchiveIn::VersionRead<myEmployeeCustomConstructor>(marchive);
  myEmployee::ArchiveIN(&this->super_myEmployee,marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive);
  return;
}

Assistant:

virtual void ArchiveIN(ChArchiveIn& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<myEmployeeCustomConstructor>();
        // remember to deserialize the parent class data too!!!
        myEmployee::ArchiveIN(marchive);
        // stream in member data (except data used in constructor, already saved in ArchiveOUTconstructor)
        marchive >> CHNVP(legs);
    }